

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
cmDebugger::cmDebuggerBreakpointManager::GetBreakpoints
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          cmDebuggerBreakpointManager *this,string *sourcePath,int64_t line)

{
  bool bVar1;
  mapped_type *this_00;
  pointer this_01;
  int64_t local_90;
  __normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
  local_88;
  bool *local_80;
  cmDebuggerSourceBreakpoint *local_78;
  __normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
  local_70;
  cmDebuggerSourceBreakpoint *local_68;
  __normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
  local_60;
  const_iterator it;
  mapped_type *all;
  unique_lock<std::mutex> lock;
  int64_t line_local;
  string *sourcePath_local;
  cmDebuggerBreakpointManager *this_local;
  vector<long,_std::allocator<long>_> *breakpoints;
  
  lock._8_8_ = line;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&all,&this->Mutex);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>_>_>
            ::operator[](&this->Breakpoints,sourcePath);
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  bVar1 = std::
          vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
          ::empty(this_00);
  if (!bVar1) {
    local_60._M_current =
         (cmDebuggerSourceBreakpoint *)
         std::
         vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
         ::begin(this_00);
    while( true ) {
      local_70._M_current = local_60._M_current;
      local_78 = (cmDebuggerSourceBreakpoint *)
                 std::
                 vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
                 ::end(this_00);
      local_80 = &lock._M_owns;
      local_68 = (cmDebuggerSourceBreakpoint *)
                 std::
                 find_if<__gnu_cxx::__normal_iterator<cmDebugger::cmDebuggerSourceBreakpoint_const*,std::vector<cmDebugger::cmDebuggerSourceBreakpoint,std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>>>,cmDebugger::cmDebuggerBreakpointManager::GetBreakpoints(std::__cxx11::string_const&,long)::__0>
                           (local_70,(__normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
                                      )local_78,(anon_class_8_1_898e5cf2_for__M_pred)local_80);
      local_60 = (__normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
                  )local_68;
      local_88._M_current =
           (cmDebuggerSourceBreakpoint *)
           std::
           vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>
           ::end(this_00);
      bVar1 = __gnu_cxx::operator!=(&local_60,&local_88);
      if (!bVar1) break;
      this_01 = __gnu_cxx::
                __normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
                ::operator->(&local_60);
      local_90 = cmDebuggerSourceBreakpoint::GetId(this_01);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(__return_storage_ptr__,&local_90)
      ;
      __gnu_cxx::
      __normal_iterator<const_cmDebugger::cmDebuggerSourceBreakpoint_*,_std::vector<cmDebugger::cmDebuggerSourceBreakpoint,_std::allocator<cmDebugger::cmDebuggerSourceBreakpoint>_>_>
      ::operator++(&local_60);
    }
  }
  it._M_current._4_4_ = 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&all);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int64_t> cmDebuggerBreakpointManager::GetBreakpoints(
  std::string const& sourcePath, int64_t line)
{
  std::unique_lock<std::mutex> lock(Mutex);
  const auto& all = Breakpoints[sourcePath];
  std::vector<int64_t> breakpoints;
  if (all.empty()) {
    return breakpoints;
  }

  auto it = all.begin();

  while ((it = std::find_if(
            it, all.end(), [&](const cmDebuggerSourceBreakpoint& breakpoint) {
              return (breakpoint.GetIsValid() && breakpoint.GetLine() == line);
            })) != all.end()) {
    breakpoints.emplace_back(it->GetId());
    ++it;
  }

  return breakpoints;
}